

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environment_navxythetamlevlat.cpp
# Opt level: O2

bool __thiscall
EnvironmentNAVXYTHETAMLEVLAT::IsValidCell(EnvironmentNAVXYTHETAMLEVLAT *this,int X,int Y)

{
  uchar ***pppuVar1;
  bool bVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  bVar2 = EnvironmentNAVXYTHETALATTICE::IsValidCell((EnvironmentNAVXYTHETALATTICE *)this,X,Y);
  uVar3 = 0;
  if (bVar2) {
    uVar4 = (ulong)(uint)this->numofadditionalzlevs;
    if (this->numofadditionalzlevs < 1) {
      uVar4 = uVar3;
    }
    uVar5 = 0;
    do {
      uVar3 = (ulong)(uVar4 == uVar5);
      if (uVar4 == uVar5) break;
      pppuVar1 = this->AddLevelGrid2D + uVar5;
      uVar5 = uVar5 + 1;
    } while ((*pppuVar1)[X][Y] <
             (this->super_EnvironmentNAVXYTHETALAT).super_EnvironmentNAVXYTHETALATTICE.
             EnvNAVXYTHETALATCfg.obsthresh);
  }
  return SUB81(uVar3,0);
}

Assistant:

bool EnvironmentNAVXYTHETAMLEVLAT::IsValidCell(int X, int Y)
{
    int levelind;

    if (!EnvironmentNAVXYTHETALAT::IsValidCell(X, Y)) return false;

    //iterate through the additional levels
    for (levelind = 0; levelind < numofadditionalzlevs; levelind++) {
        if (AddLevelGrid2D[levelind][X][Y] >= EnvNAVXYTHETALATCfg.obsthresh) return false;
    }
    //otherwise the cell is valid at all levels
    return true;
}